

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

bool __thiscall
kj::Directory::tryTransfer
          (Directory *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,PathPtr fromPath
          ,TransferMode mode)

{
  int iVar1;
  Fault f;
  TransferMode TVar2;
  Fault local_68;
  Type local_60;
  
  if (toPath.parts.size_ == 0) {
    tryTransfer();
  }
  else {
    TVar2 = mode;
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x15])
              (&local_68,fromDirectory,this);
    if ((char)local_68.exception != '\0') goto LAB_0035b4c4;
    if (mode == MOVE) {
      iVar1 = (*(this->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x14])
                        (this,toPath.parts.ptr,toPath.parts.size_,(ulong)toMode,fromDirectory,2,
                         fromPath.parts.ptr._0_4_,(undefined4)fromPath.parts.size_,TVar2);
      if ((char)iVar1 != '\0') {
        remove(fromDirectory,(char *)fromPath.parts.ptr);
        local_68.exception._1_1_ = 1;
        goto LAB_0035b4c4;
      }
    }
    else {
      if (mode == LINK) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
                  (&local_68,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x2e4,FAILED,(char *)0x0,
                   "\"can\'t link across different Directory implementations\"",
                   (char (*) [54])"can\'t link across different Directory implementations");
        _::Debug::Fault::~Fault(&local_68);
        local_68.exception._1_1_ = 0;
        goto LAB_0035b4c4;
      }
      if (mode != COPY) {
        _::unreachable();
      }
      (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[9])
                (&local_68,fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
      if ((char)local_68.exception == '\x01') {
        local_68.exception._1_1_ =
             tryCopyDirectoryEntry
                       (this,toPath,toMode,&fromDirectory->super_ReadableDirectory,fromPath,local_60
                        ,true);
        goto LAB_0035b4c4;
      }
    }
  }
  local_68.exception._1_1_ = 0;
LAB_0035b4c4:
  return (bool)(local_68.exception._1_1_ & 1);
}

Assistant:

bool Directory::tryTransfer(PathPtr toPath, WriteMode toMode,
                            const Directory& fromDirectory, PathPtr fromPath,
                            TransferMode mode) const {
  KJ_REQUIRE(toPath.size() > 0, "can't replace self") { return false; }

  // First try reversing.
  KJ_IF_MAYBE(result, fromDirectory.tryTransferTo(*this, toPath, toMode, fromPath, mode)) {
    return *result;
  }

  switch (mode) {
    case TransferMode::COPY:
      KJ_IF_MAYBE(meta, fromDirectory.tryLstat(fromPath)) {
        return tryCopyDirectoryEntry(*this, toPath, toMode, fromDirectory,
                                     fromPath, meta->type, true);
      } else {
        // Source doesn't exist.
        return false;
      }
    case TransferMode::MOVE:
      // Implement move as copy-then-delete.
      if (!tryTransfer(toPath, toMode, fromDirectory, fromPath, TransferMode::COPY)) {
        return false;
      }
      fromDirectory.remove(fromPath);
      return true;
    case TransferMode::LINK:
      KJ_FAIL_REQUIRE("can't link across different Directory implementations") { return false; }
  }

  KJ_UNREACHABLE;
}